

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_back_by_singe_char_Test<char16_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_back_by_singe_char_Test<char16_t> *this)

{
  bool bVar1;
  char16_t delim;
  char16_t *__str;
  char *message;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_R9;
  AssertionHelper local_230;
  Fixed local_1f0;
  char16_t *local_68;
  undefined1 local_60 [8];
  AssertionResult iutest_ar;
  undefined1 local_30 [8];
  basic_string_view<char16_t,_std::char_traits<char16_t>_> re;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> s;
  iu_StringViewSplit_x_iutest_x_chain_back_by_singe_char_Test<char16_t> *this_local;
  
  __str = constant::arikitari_na_world<char16_t>();
  std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::basic_string_view
            ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&re._M_str,__str);
  delim = constant::space<char16_t>();
  iutest_ar._36_2_ = split<char16_t,_nullptr>(delim);
  back();
  iutest_ar._38_2_ =
       detail::split_helper<char16_t,_true,_false,_false>::operator>><detail::get_back,_nullptr>
                 ((split_helper<char16_t,_true,_false,_false> *)&iutest_ar.field_0x24);
  _local_30 = detail::
              operator|<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_char16_t,_char16_t,_nullptr>
                        ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&re._M_str,
                         (split_helper_subroutine<detail::get_back,_char16_t,_char16_t> *)
                         &iutest_ar.field_0x26);
  iutest::detail::AlwaysZero();
  local_68 = constant::world<char16_t>();
  iutest::internal::EqHelper<false>::
  Compare<char16_t_const*,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            ((AssertionResult *)local_60,(EqHelper<false> *)"constant::world<char_type>()","re",
             (char *)&local_68,(char16_t **)local_30,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    message = iutest::AssertionResult::message((AssertionResult *)local_60);
    iutest::AssertionHelper::AssertionHelper
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x32,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_230,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper(&local_230);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_back_by_singe_char)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world<char_type>();
	const auto re = s | split(constant::space<char_type>()) >> back();
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re);
}